

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O0

double xc_bessel_K0_scaled(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double r;
  double dVar4;
  
  dVar4 = 0.0;
  if (0.0 < in_XMM0_Qa) {
    if (2.0 < in_XMM0_Qa) {
      if (8.0 < in_XMM0_Qa) {
        dVar1 = xc_cheb_eval(16.0 / in_XMM0_Qa - 1.0,ak02_data,0xe);
        dVar4 = sqrt(in_XMM0_Qa);
        dVar4 = (dVar1 + 1.25) / dVar4;
      }
      else {
        dVar1 = xc_cheb_eval((16.0 / in_XMM0_Qa - 5.0) / 3.0,ak0_data,0x11);
        dVar4 = sqrt(in_XMM0_Qa);
        dVar4 = (dVar1 + 1.25) / dVar4;
      }
    }
    else {
      dVar1 = exp(in_XMM0_Qa);
      dVar2 = log(in_XMM0_Qa * 0.5);
      dVar4 = xc_bessel_I0(dVar4);
      dVar3 = xc_cheb_eval(in_XMM0_Qa * 0.5 * in_XMM0_Qa + -1.0,bk0_data,0xb);
      dVar4 = dVar1 * (-dVar2 * dVar4 + -0.25 + dVar3);
    }
  }
  else {
    fprintf(_stderr,"Domain error in bessel_K0_scaled\n");
  }
  return dVar4;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K0_scaled(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K0_scaled\n");
#endif
  }
  else if(x <= 2.0)
    r = exp(x)*(-log(0.5*x)*xc_bessel_I0(x) - 0.25 + xc_cheb_eval(0.5*x*x - 1.0, bk0_data, 11));
  else if(x <= 8.0)
    r = (1.25 + xc_cheb_eval((16.0/x - 5.0)/3.0, ak0_data, 17))/sqrt(x);
  else
    r = (1.25 + xc_cheb_eval(16.0/x - 1.0, ak02_data, 14))/sqrt(x);

  return r;
}